

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O1

void __thiscall sentencepiece::ModelProto::MergeFrom(ModelProto *this,ModelProto *from)

{
  InternalMetadata *this_00;
  uint uVar1;
  void *pvVar2;
  Rep *pRVar3;
  void **our_elems;
  TrainerSpec *pTVar4;
  NormalizerSpec *pNVar5;
  SelfTestData *pSVar6;
  int iVar7;
  undefined1 *puVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  Arena *pAVar10;
  
  google::protobuf::internal::ExtensionSet::MergeFrom(&this->_extensions_,&from->_extensions_);
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  pvVar2 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    if (((ulong)this_00->ptr_ & 1) == 0) {
      pbVar9 = google::protobuf::internal::InternalMetadata::
               mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
    }
    else {
      pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
    }
    std::__cxx11::string::_M_append
              ((char *)pbVar9,*(ulong *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 8));
  }
  iVar7 = (from->pieces_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar7 != 0) {
    pRVar3 = (from->pieces_).super_RepeatedPtrFieldBase.rep_;
    our_elems = google::protobuf::internal::RepeatedPtrFieldBase::InternalExtend
                          (&(this->pieces_).super_RepeatedPtrFieldBase,iVar7);
    google::protobuf::internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<sentencepiece::ModelProto_SentencePiece>::TypeHandler>
              (&(this->pieces_).super_RepeatedPtrFieldBase,our_elems,pRVar3->elements,iVar7,
               ((this->pieces_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->pieces_).super_RepeatedPtrFieldBase.current_size_);
    iVar7 = iVar7 + (this->pieces_).super_RepeatedPtrFieldBase.current_size_;
    (this->pieces_).super_RepeatedPtrFieldBase.current_size_ = iVar7;
    pRVar3 = (this->pieces_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3->allocated_size < iVar7) {
      pRVar3->allocated_size = iVar7;
    }
  }
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 0xf) != 0) {
    if ((uVar1 & 1) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      if (this->trainer_spec_ == (TrainerSpec *)0x0) {
        pAVar10 = (Arena *)this_00->ptr_;
        if (((ulong)pAVar10 & 1) != 0) {
          pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
        }
        pTVar4 = google::protobuf::Arena::CreateMaybeMessage<sentencepiece::TrainerSpec>(pAVar10);
        this->trainer_spec_ = pTVar4;
      }
      puVar8 = (undefined1 *)from->trainer_spec_;
      if ((TrainerSpec *)puVar8 == (TrainerSpec *)0x0) {
        puVar8 = _TrainerSpec_default_instance_;
      }
      TrainerSpec::MergeFrom(this->trainer_spec_,(TrainerSpec *)puVar8);
    }
    if ((uVar1 & 2) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      if (this->normalizer_spec_ == (NormalizerSpec *)0x0) {
        pAVar10 = (Arena *)this_00->ptr_;
        if (((ulong)pAVar10 & 1) != 0) {
          pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
        }
        pNVar5 = google::protobuf::Arena::CreateMaybeMessage<sentencepiece::NormalizerSpec>(pAVar10)
        ;
        this->normalizer_spec_ = pNVar5;
      }
      puVar8 = (undefined1 *)from->normalizer_spec_;
      if ((NormalizerSpec *)puVar8 == (NormalizerSpec *)0x0) {
        puVar8 = _NormalizerSpec_default_instance_;
      }
      NormalizerSpec::MergeFrom(this->normalizer_spec_,(NormalizerSpec *)puVar8);
    }
    if ((uVar1 & 4) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      if (this->self_test_data_ == (SelfTestData *)0x0) {
        pAVar10 = (Arena *)this_00->ptr_;
        if (((ulong)pAVar10 & 1) != 0) {
          pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
        }
        pSVar6 = google::protobuf::Arena::CreateMaybeMessage<sentencepiece::SelfTestData>(pAVar10);
        this->self_test_data_ = pSVar6;
      }
      puVar8 = (undefined1 *)from->self_test_data_;
      if ((SelfTestData *)puVar8 == (SelfTestData *)0x0) {
        puVar8 = _SelfTestData_default_instance_;
      }
      SelfTestData::MergeFrom(this->self_test_data_,(SelfTestData *)puVar8);
    }
    if ((uVar1 & 8) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      if (this->denormalizer_spec_ == (NormalizerSpec *)0x0) {
        pAVar10 = (Arena *)this_00->ptr_;
        if (((ulong)pAVar10 & 1) != 0) {
          pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
        }
        pNVar5 = google::protobuf::Arena::CreateMaybeMessage<sentencepiece::NormalizerSpec>(pAVar10)
        ;
        this->denormalizer_spec_ = pNVar5;
      }
      puVar8 = (undefined1 *)from->denormalizer_spec_;
      if ((NormalizerSpec *)puVar8 == (NormalizerSpec *)0x0) {
        puVar8 = _NormalizerSpec_default_instance_;
      }
      NormalizerSpec::MergeFrom(this->denormalizer_spec_,(NormalizerSpec *)puVar8);
      return;
    }
  }
  return;
}

Assistant:

void ModelProto::MergeFrom(const ModelProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:sentencepiece.ModelProto)
  GOOGLE_DCHECK_NE(&from, this);
  _extensions_.MergeFrom(from._extensions_);
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  pieces_.MergeFrom(from.pieces_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x0000000fu) {
    if (cached_has_bits & 0x00000001u) {
      _internal_mutable_trainer_spec()->::sentencepiece::TrainerSpec::MergeFrom(from._internal_trainer_spec());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_mutable_normalizer_spec()->::sentencepiece::NormalizerSpec::MergeFrom(from._internal_normalizer_spec());
    }
    if (cached_has_bits & 0x00000004u) {
      _internal_mutable_self_test_data()->::sentencepiece::SelfTestData::MergeFrom(from._internal_self_test_data());
    }
    if (cached_has_bits & 0x00000008u) {
      _internal_mutable_denormalizer_spec()->::sentencepiece::NormalizerSpec::MergeFrom(from._internal_denormalizer_spec());
    }
  }
}